

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O0

void object_see(player *p,object *obj)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  _Bool _Var1;
  object *poVar2;
  loc_conflict old;
  object *new_obj;
  loc_conflict grid;
  object *known_obj;
  object *obj_local;
  player *p_local;
  
  poVar2 = p->cave->objects[obj->oidx];
  grid_00 = obj->grid;
  new_obj._0_4_ = grid_00.x;
  new_obj._4_4_ = grid_00.y;
  if (poVar2 == (object *)0x0) {
    if (obj->known != (object *)0x0) {
      __assert_fail("! obj->known",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                    ,0x3c9,"void object_see(struct player *, struct object *)");
    }
    poVar2 = object_new();
    obj->known = poVar2;
    object_set_base_known(p,obj);
    p->cave->objects[obj->oidx] = poVar2;
    poVar2->oidx = obj->oidx;
    if (obj->held_m_idx == 0) {
      poVar2->grid = grid_00;
      pile_insert_end(&p->cave->squares[new_obj._4_4_][(wchar_t)new_obj].obj,poVar2);
    }
  }
  else {
    grid_01 = poVar2->grid;
    if (poVar2 != obj->known) {
      __assert_fail("known_obj == obj->known",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                    ,0x3dc,"void object_see(struct player *, struct object *)");
    }
    if (poVar2->kind == obj->kind) {
      poVar2->number = obj->number;
    }
    else {
      object_set_base_known(p,obj);
    }
    if ((obj->held_m_idx == 0) &&
       (_Var1 = square_holds_object((chunk *)p->cave,grid_00,poVar2), !_Var1)) {
      _Var1 = loc_is_zero((loc)grid_01);
      if ((!_Var1) && (_Var1 = square_holds_object((chunk *)p->cave,grid_01,poVar2), _Var1)) {
        square_excise_object((chunk *)p->cave,grid_01,poVar2);
      }
      poVar2->grid = grid_00;
      pile_insert_end(&p->cave->squares[new_obj._4_4_][(wchar_t)new_obj].obj,poVar2);
    }
  }
  return;
}

Assistant:

void object_see(struct player *p, struct object *obj)
{
	struct object *known_obj = p->cave->objects[obj->oidx];
	struct loc grid = obj->grid;

	/* Make new known objects, fully know sensed ones, relocate old ones */
	if (known_obj == NULL) {
		/* Make a new one */
		struct object *new_obj;

		assert(! obj->known);
		new_obj = object_new();
		obj->known = new_obj;
		object_set_base_known(p, obj);

		/* List the known object */
		p->cave->objects[obj->oidx] = new_obj;
		new_obj->oidx = obj->oidx;

		/* If monster held, we're done */
		if (obj->held_m_idx) return;

		/* Attach it to the current floor pile */
		new_obj->grid = grid;
		pile_insert_end(&p->cave->squares[grid.y][grid.x].obj, new_obj);
	} else {
		struct loc old = known_obj->grid;

		/* Make sure knowledge is correct */
		assert(known_obj == obj->known);

		if (known_obj->kind != obj->kind) {
			/* Copy over actual details */
			object_set_base_known(p, obj);
		} else {
			known_obj->number = obj->number;
		}

		/* If monster held, we're done */
		if (obj->held_m_idx) return;

		/* Attach it to the current floor pile if necessary */
		if (! square_holds_object(p->cave, grid, known_obj)) {
			/* Detach from any old pile */
			if (!loc_is_zero(old) && square_holds_object(p->cave, old, known_obj)) {
				square_excise_object(p->cave, old, known_obj);
			}

			known_obj->grid = grid;
			pile_insert_end(&p->cave->squares[grid.y][grid.x].obj, known_obj);
		}
	}
}